

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O1

Mtbdd __thiscall
sylvan::Mtbdd::Permute
          (Mtbdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *from,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *to)

{
  uint32_t key;
  bool bVar1;
  Mtbdd *pMVar2;
  uint uVar3;
  long *in_RCX;
  long lVar4;
  long lVar5;
  MtbddMap map;
  MTBDD local_90;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  Mtbdd *local_78;
  Task local_70;
  
  local_90 = 0;
  local_80 = from;
  local_78 = this;
  mtbdd_protect(&local_90);
  uVar3 = (int)((ulong)(*(long *)(to + 8) - *(long *)to) >> 2) - 1;
  if (-1 < (int)uVar3) {
    lVar4 = (ulong)uVar3 + 1;
    do {
      key = *(uint32_t *)(*(long *)to + -4 + lVar4 * 4);
      local_70.f = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                   mtbdd_ithvar(*(uint32_t *)(*in_RCX + -4 + lVar4 * 4));
      mtbdd_protect((MTBDD *)&local_70);
      local_88 = local_70.f;
      mtbdd_protect((MTBDD *)&local_88);
      local_90 = mtbdd_map_add(local_90,key,(MTBDD)local_88);
      mtbdd_unprotect((MTBDD *)&local_88);
      mtbdd_unprotect((MTBDD *)&local_70);
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  local_70.d._0_8_ = *(undefined8 *)local_80;
  local_70.f = mtbdd_compose_WRAP;
  local_70.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  local_70.d[8] = (undefined1)local_90;
  local_70.d[9] = local_90._1_1_;
  local_70.d[10] = local_90._2_1_;
  local_70.d[0xb] = local_90._3_1_;
  local_70.d[0xc] = local_90._4_1_;
  local_70.d[0xd] = local_90._5_1_;
  local_70.d[0xe] = local_90._6_1_;
  local_70.d[0xf] = local_90._7_1_;
  lace_run_task(&local_70);
  pMVar2 = local_78;
  local_78->mtbdd = local_70.d._0_8_;
  mtbdd_protect(&local_78->mtbdd);
  mtbdd_unprotect(&local_90);
  return (Mtbdd)(MTBDD)pMVar2;
}

Assistant:

Mtbdd
Mtbdd::Permute(const std::vector<uint32_t>& from, const std::vector<uint32_t>& to) const
{
    /* Create a map */
    MtbddMap map;
    for (int i=from.size()-1; i>=0; i--) {
        map.put(from[i], Bdd::bddVar(to[i]));
    }

    return mtbdd_compose(mtbdd, map.mtbdd);
}